

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O3

void coords_desc(char *buf,wchar_t size,wchar_t y,wchar_t x)

{
  wchar_t wVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  
  wVar1 = (player->grid).y;
  uVar4 = y - wVar1;
  pcVar5 = "N";
  if (uVar4 != 0 && wVar1 <= y) {
    pcVar5 = "S";
  }
  wVar1 = (player->grid).x;
  uVar3 = x - wVar1;
  pcVar6 = "E";
  if (x < wVar1) {
    pcVar6 = "W";
  }
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  strnfmt(buf,(long)size,"%d %s, %d %s",(ulong)uVar2,pcVar5,(ulong)uVar4,pcVar6);
  return;
}

Assistant:

void coords_desc(char *buf, int size, int y, int x)
{
	const char *east_or_west;
	const char *north_or_south;

	int py = player->grid.y;
	int px = player->grid.x;

	if (y > py)
		north_or_south = "S";
	else
		north_or_south = "N";

	if (x < px)
		east_or_west = "W";
	else
		east_or_west = "E";

	strnfmt(buf, size, "%d %s, %d %s",
		ABS(y - py), north_or_south, ABS(x-px), east_or_west);
}